

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

void __thiscall
btConvexHullInternal::computeInternal
          (btConvexHullInternal *this,int start,int end,IntermediateHull *result)

{
  int iVar1;
  int iVar2;
  Vertex **ppVVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Vertex *pVVar8;
  Edge *pEVar9;
  long lVar10;
  Vertex *pVVar11;
  Vertex *pVVar12;
  Vertex *pVVar13;
  Vertex *pVVar14;
  undefined1 auVar15 [16];
  IntermediateHull hull1;
  
  iVar6 = end - start;
  if (iVar6 == 0) {
    auVar15 = (undefined1  [16])0x0;
  }
  else {
    if (iVar6 == 2) {
      pVVar14 = (this->originalVertices).m_data[start];
      bVar5 = Point32::operator!=(&pVVar14->point,&pVVar14[1].point);
      if (bVar5) {
        pVVar13 = pVVar14 + 1;
        iVar6 = (pVVar14->point).x;
        iVar7 = (pVVar14->point).y;
        iVar1 = pVVar14[1].point.x;
        iVar2 = pVVar14[1].point.y;
        pVVar8 = pVVar13;
        if (iVar7 == iVar2 && iVar6 == iVar1) {
          iVar7 = (pVVar14->point).z;
          iVar6 = pVVar14[1].point.z;
          if (iVar6 < iVar7) {
            pVVar13 = pVVar14;
          }
          if (iVar7 <= iVar6) {
            pVVar8 = pVVar14;
          }
          pVVar14[iVar6 < iVar7].next = pVVar14 + (iVar6 < iVar7);
          pVVar8->prev = pVVar8;
          result->minXy = pVVar8;
          result->maxXy = pVVar8;
          pVVar11 = pVVar8;
          pVVar14 = pVVar8;
        }
        else {
          bVar5 = iVar6 < iVar1;
          pVVar14->next = pVVar13;
          pVVar14->prev = pVVar13;
          pVVar14[1].next = pVVar14;
          pVVar14[1].prev = pVVar14;
          bVar4 = iVar7 < iVar2;
          pVVar12 = pVVar14;
          pVVar11 = pVVar13;
          if (iVar6 == iVar1 && bVar4 || bVar5) {
            pVVar12 = pVVar13;
            pVVar11 = pVVar14;
          }
          result->minXy = pVVar11;
          if (iVar7 == iVar2 && bVar5 || bVar4) {
            pVVar8 = pVVar14;
          }
          result->maxXy = pVVar12;
          pVVar11 = pVVar14;
          if (iVar7 == iVar2 && bVar5 || bVar4) {
            pVVar11 = pVVar13;
          }
        }
        result->minYx = pVVar8;
        result->maxYx = pVVar11;
        pEVar9 = newEdgePair(this,pVVar14,pVVar13);
        pEVar9->next = pEVar9;
        pEVar9->prev = pEVar9;
        pVVar14->edges = pEVar9;
        pEVar9 = pEVar9->reverse;
        pEVar9->next = pEVar9;
        pEVar9->prev = pEVar9;
        pVVar13->edges = pEVar9;
        return;
      }
    }
    else if (iVar6 != 1) {
      iVar7 = iVar6 / 2 + start;
      ppVVar3 = (this->originalVertices).m_data;
      lVar10 = (long)iVar7;
      pVVar14 = ppVVar3[lVar10 + -1];
      iVar6 = iVar7;
      if (iVar7 < end) {
        iVar6 = end;
      }
      do {
        if (end <= lVar10) {
LAB_0012663f:
          computeInternal(this,start,iVar7,result);
          hull1.minYx = (Vertex *)0x0;
          hull1.maxYx = (Vertex *)0x0;
          hull1.minXy = (Vertex *)0x0;
          hull1.maxXy = (Vertex *)0x0;
          computeInternal(this,iVar6,end,&hull1);
          merge(this,result,&hull1);
          return;
        }
        pVVar13 = ppVVar3[lVar10];
        if ((((pVVar13->point).x != (pVVar14->point).x) ||
            ((pVVar13->point).y != (pVVar14->point).y)) ||
           ((pVVar13->point).z != (pVVar14->point).z)) {
          iVar6 = (int)lVar10;
          goto LAB_0012663f;
        }
        lVar10 = lVar10 + 1;
      } while( true );
    }
    pVVar14 = (this->originalVertices).m_data[start];
    pVVar14->edges = (Edge *)0x0;
    pVVar14->next = pVVar14;
    pVVar14->prev = pVVar14;
    auVar15._8_4_ = (int)pVVar14;
    auVar15._0_8_ = pVVar14;
    auVar15._12_4_ = (int)((ulong)pVVar14 >> 0x20);
  }
  result->minYx = (Vertex *)auVar15._0_8_;
  result->maxYx = (Vertex *)auVar15._8_8_;
  result->minXy = (Vertex *)auVar15._0_8_;
  result->maxXy = (Vertex *)auVar15._8_8_;
  return;
}

Assistant:

void btConvexHullInternal::computeInternal(int start, int end, IntermediateHull& result)
{
	int n = end - start;
	switch (n)
	{
		case 0:
			result.minXy = NULL;
			result.maxXy = NULL;
			result.minYx = NULL;
			result.maxYx = NULL;
			return;
		case 2:
		{
			Vertex* v = originalVertices[start];
			Vertex* w = v + 1;
			if (v->point != w->point)
			{
				int32_t dx = v->point.x - w->point.x;
				int32_t dy = v->point.y - w->point.y;

				if ((dx == 0) && (dy == 0))
				{
					if (v->point.z > w->point.z)
					{
						Vertex* t = w;
						w = v;
						v = t;
					}
					btAssert(v->point.z < w->point.z);
					v->next = v;
					v->prev = v;
					result.minXy = v;
					result.maxXy = v;
					result.minYx = v;
					result.maxYx = v;
				}
				else
				{
					v->next = w;
					v->prev = w;
					w->next = v;
					w->prev = v;

					if ((dx < 0) || ((dx == 0) && (dy < 0)))
					{
						result.minXy = v;
						result.maxXy = w;
					}
					else
					{
						result.minXy = w;
						result.maxXy = v;
					}

					if ((dy < 0) || ((dy == 0) && (dx < 0)))
					{
						result.minYx = v;
						result.maxYx = w;
					}
					else
					{
						result.minYx = w;
						result.maxYx = v;
					}
				}

				Edge* e = newEdgePair(v, w);
				e->link(e);
				v->edges = e;

				e = e->reverse;
				e->link(e);
				w->edges = e;

				return;
			}
		}
		// lint -fallthrough
		case 1:
		{
			Vertex* v = originalVertices[start];
			v->edges = NULL;
			v->next = v;
			v->prev = v;

			result.minXy = v;
			result.maxXy = v;
			result.minYx = v;
			result.maxYx = v;

			return;
		}
	}

	int split0 = start + n / 2;
	Point32 p = originalVertices[split0-1]->point;
	int split1 = split0;
	while ((split1 < end) && (originalVertices[split1]->point == p))
	{
		split1++;
	}
	computeInternal(start, split0, result);
	IntermediateHull hull1;
	computeInternal(split1, end, hull1);
#ifdef DEBUG_CONVEX_HULL
	printf("\n\nMerge\n");
	result.print();
	hull1.print();
#endif
	merge(result, hull1);
#ifdef DEBUG_CONVEX_HULL
	printf("\n  Result\n");
	result.print();
#endif
}